

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

SoapySDRRange *
SoapySDRDevice_getSampleRateRange
          (SoapySDRDevice *device,int direction,size_t channel,size_t *length)

{
  SoapySDRRange *pSVar1;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  exception *ex;
  vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *in_stack_ffffffffffffffb0;
  undefined1 local_40 [8];
  size_t *in_stack_ffffffffffffffc8;
  RangeList *in_stack_ffffffffffffffd0;
  
  *in_RCX = 0;
  SoapySDRDevice_clearError();
  (**(code **)(*in_RDI + 0x210))(local_40,in_RDI,in_ESI,in_RDX);
  pSVar1 = toRangeList(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~vector(in_stack_ffffffffffffffb0)
  ;
  return pSVar1;
}

Assistant:

SoapySDRRange *SoapySDRDevice_getSampleRateRange(const SoapySDRDevice *device, const int direction, const size_t channel, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toRangeList(device->getSampleRateRange(direction, channel), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}